

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O2

Box * trigBox(Box *__return_storage_ptr__,int t,Mesh *m)

{
  Vector3f *this;
  float fVar1;
  float *pfVar2;
  Vector3f *pVVar3;
  int ii;
  int index;
  int dim;
  int i;
  
  Box::Box(__return_storage_ptr__);
  Vector3f::operator=(&__return_storage_ptr__->mn,
                      (Vector3f *)
                      &(m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                       _M_impl.super__Vector_impl_data._M_start[t].field_0x30);
  this = &__return_storage_ptr__->mx;
  Vector3f::operator=(this,(Vector3f *)
                           &(m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                            _M_impl.super__Vector_impl_data._M_start[t].field_0x30);
  for (index = 1; index != 3; index = index + 1) {
    for (i = 0; i != 3; i = i + 1) {
      pfVar2 = Vector3f::operator[](&__return_storage_ptr__->mn,i);
      fVar1 = *pfVar2;
      pVVar3 = Triangle::getVertex((m->_triangles).
                                   super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                                   super__Vector_impl_data._M_start + t,index);
      pfVar2 = Vector3f::operator[](pVVar3,i);
      if (*pfVar2 <= fVar1 && fVar1 != *pfVar2) {
        pVVar3 = Triangle::getVertex((m->_triangles).
                                     super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                                     .super__Vector_impl_data._M_start + t,index);
        pfVar2 = Vector3f::operator[](pVVar3,i);
        fVar1 = *pfVar2;
        pfVar2 = Vector3f::operator[](&__return_storage_ptr__->mn,i);
        *pfVar2 = fVar1;
      }
      pfVar2 = Vector3f::operator[](this,i);
      fVar1 = *pfVar2;
      pVVar3 = Triangle::getVertex((m->_triangles).
                                   super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                                   super__Vector_impl_data._M_start + t,index);
      pfVar2 = Vector3f::operator[](pVVar3,i);
      if (fVar1 < *pfVar2) {
        pVVar3 = Triangle::getVertex((m->_triangles).
                                     super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                                     .super__Vector_impl_data._M_start + t,index);
        pfVar2 = Vector3f::operator[](pVVar3,i);
        fVar1 = *pfVar2;
        pfVar2 = Vector3f::operator[](this,i);
        *pfVar2 = fVar1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Box
trigBox(int t, const Mesh &m) {
    const auto &tri = m.getTriangles();

    Box b;
    b.mn = tri[t].getVertex(0);
    b.mx = tri[t].getVertex(0);

    for (int ii = 1; ii < 3; ii++) {
        for (int dim = 0; dim < 3; dim++) {
            if (b.mn[dim] > tri[t].getVertex(ii)[dim]) {
                b.mn[dim] = tri[t].getVertex(ii)[dim];
            }
            if (b.mx[dim] < tri[t].getVertex(ii)[dim]) {
                b.mx[dim] = tri[t].getVertex(ii)[dim];
            }
        }
    }
    return b;
}